

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

bool __thiscall
BTree<StringBTree,_StringKey>::searchByIndex
          (BTree<StringBTree,_StringKey> *this,uint index,StringKey *key)

{
  unsigned_short uVar1;
  uint16_t uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint in_ESI;
  undefined8 *in_RDI;
  uint16_t offset;
  uint16_t nextOffset;
  uint high;
  uint i;
  unsigned_short nodeCount;
  uint offsetAndCount;
  uint8_t *p;
  StringBTree *self;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  uint16_t in_stack_ffffffffffffffc6;
  uint in_stack_ffffffffffffffc8;
  uint uVar5;
  undefined2 in_stack_ffffffffffffffd0;
  uchar *local_28;
  uint local_c;
  
  local_28 = (uchar *)*in_RDI;
  uVar3 = readNextWithByteSwap<unsigned_int,unsigned_char>
                    ((uchar **)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)));
  uVar1 = readNextWithByteSwap<unsigned_short,unsigned_char>
                    ((uchar **)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)));
  local_c = in_ESI;
  for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
    uVar2 = getBitsAt((uint8_t *)
                      CONCAT26(in_stack_ffffffffffffffc6,
                               CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                      in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc8 = uVar2 & 0x7ff;
    in_stack_ffffffffffffffc6 =
         getBitsAt((uint8_t *)
                   CONCAT26(in_stack_ffffffffffffffc6,
                            CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                   in_stack_ffffffffffffffbc);
    if (local_c < in_stack_ffffffffffffffc8) break;
    local_c = local_c - in_stack_ffffffffffffffc8;
    local_28 = advancePointer<unsigned_char>(local_28,(ulong)in_stack_ffffffffffffffc6);
  }
  uVar2 = getBitsAt((uint8_t *)
                    CONCAT26(in_stack_ffffffffffffffc6,
                             CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                    in_stack_ffffffffffffffbc);
  advancePointer<unsigned_char>(local_28,(ulong)uVar2);
  puVar4 = StringBTree::parseData
                     ((StringBTree *)CONCAT44(uVar3,CONCAT22(uVar1,in_stack_ffffffffffffffd0)),
                      (KeyType *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                      (uint8_t *)
                      CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(uVar2,in_stack_ffffffffffffffc0)))
  ;
  return puVar4 != (uint8_t *)0x0;
}

Assistant:

bool searchByIndex(unsigned int index, Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);

			if (index < high)
				break;
			index -= high;

			p = advancePointer(p, nextOffset);
		}
		
		const auto offset = getBitsAt(p, index + 1);
		p = advancePointer(p, offset);
		
		return self.parseData(key, p) != nullptr;
	}